

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

vector<poly,_std::allocator<poly>_> * __thiscall
matrix::rref_nullspace
          (vector<poly,_std::allocator<poly>_> *__return_storage_ptr__,matrix *this,
          vector<int,_std::allocator<int>_> *piv)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  int i_00;
  size_t i;
  ulong __n;
  ulong __n_00;
  poly p;
  
  std::__debug::vector<poly,_std::allocator<poly>_>::vector(__return_storage_ptr__);
  __n = 0;
  i_00 = 0;
  do {
    if (this->ncols <= i_00) {
      return __return_storage_ptr__;
    }
    if (__n < (ulong)((long)(piv->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(piv->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2)) {
      pvVar2 = std::__debug::vector<int,_std::allocator<int>_>::operator[](piv,__n);
      if (i_00 != *pvVar2) goto LAB_0011239d;
      __n = __n + 1;
    }
    else {
LAB_0011239d:
      pvVar3 = std::__debug::vector<poly,_std::allocator<poly>_>::operator[](&this->rows,0);
      poly::poly(&p,(long)(int)((*(int *)&(pvVar3->x).
                                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                 *(int *)&(pvVar3->x).
                                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start & 0x1ffffffcU)
                               << 3));
      poly::xor_bit(&p,i_00,1);
      for (__n_00 = 0;
          __n_00 < (ulong)((long)(piv->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(piv->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2); __n_00 = __n_00 + 1) {
        pvVar3 = std::__debug::vector<poly,_std::allocator<poly>_>::operator[](&this->rows,__n_00);
        iVar1 = poly::operator[](pvVar3,i_00);
        if (iVar1 != 0) {
          pvVar2 = std::__debug::vector<int,_std::allocator<int>_>::operator[](piv,__n_00);
          poly::xor_bit(&p,*pvVar2,1);
        }
      }
      std::__debug::vector<poly,_std::allocator<poly>_>::push_back(__return_storage_ptr__,&p);
      std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&p.x);
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

std::vector<poly> matrix::rref_nullspace(const std::vector<int> &piv) const {
    std::vector<poly> ret;
    size_t k = 0;
    for (int j = 0; j < ncols; j++) {
        if (k < piv.size() && j == piv[k]) {
            k++;
            continue;
        }
        poly p(rows[0].bits());
        p.xor_bit(j, 1);
        for (size_t i = 0; i < piv.size(); i++)
            if (rows[i][j])
                p.xor_bit(piv[i], 1);
        ret.push_back(p);
    }
    return ret;
}